

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

uint64_t __thiscall FFFBFFFDReader::size(FFFBFFFDReader *this)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 extraout_var_00;
  uint uVar6;
  
  if ((this->_areamap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    puts("note: fffbfffd filesize not yet accurately known");
    iVar3 = (*((this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ReadWriter[6])();
    uVar6 = this->_blocksize;
    uVar5 = CONCAT44(extraout_var_00,iVar3) / (ulong)(uVar6 + 8);
  }
  else {
    lVar4 = std::_Rb_tree_decrement(&(this->_areamap)._M_t._M_impl.super__Rb_tree_header._M_header);
    lVar2 = *(long *)(lVar4 + 0x30);
    uVar1 = *(uint *)(lVar4 + 0x38);
    iVar3 = (*((this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ReadWriter[6])();
    uVar6 = this->_blocksize;
    uVar5 = (ulong)(CONCAT44(extraout_var,iVar3) - lVar2) / (ulong)(uVar6 + 8) + (ulong)uVar1;
  }
  return uVar6 * uVar5;
}

Assistant:

virtual uint64_t size()
    {
        if (_areamap.empty()) {
            printf("note: fffbfffd filesize not yet accurately known\n");
            return (_r->size()/(_blocksize+8))*_blocksize;
        }
        auto lastblock= _areamap.rbegin()->second;
        return ((_r->size()-lastblock.fileoffset)/(_blocksize+8)+lastblock.firstblock)*_blocksize;
    }